

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O1

void __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::SetBase(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *this)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  Ch *pCVar5;
  
  pCVar5 = this->base_;
  pcVar1 = this->scheme_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar5,pcVar1,sVar2);
  if (this->scheme_ == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(this->scheme_);
    uVar3 = sVar2 & 0xffffffff;
  }
  pCVar5 = pCVar5 + uVar3;
  pcVar1 = this->auth_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar5,pcVar1,sVar2);
  if (this->auth_ == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(this->auth_);
    uVar3 = sVar2 & 0xffffffff;
  }
  pCVar5 = pCVar5 + uVar3;
  pcVar1 = this->path_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar5,pcVar1,sVar2);
  if (this->path_ == (char *)0x0) {
    uVar3 = 0;
  }
  else {
    sVar2 = strlen(this->path_);
    uVar3 = sVar2 & 0xffffffff;
  }
  pcVar1 = this->query_;
  if (pcVar1 == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(pcVar1);
    sVar2 = sVar2 & 0xffffffff;
  }
  memcpy(pCVar5 + uVar3,pcVar1,sVar2);
  if (this->query_ == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    sVar2 = strlen(this->query_);
    uVar4 = sVar2 & 0xffffffff;
  }
  (pCVar5 + uVar3)[uVar4] = '\0';
  return;
}

Assistant:

void SetBase() {
        Ch* next = base_;
        std::memcpy(next, scheme_, GetSchemeStringLength() * sizeof(Ch));
        next+= GetSchemeStringLength();
        std::memcpy(next, auth_, GetAuthStringLength() * sizeof(Ch));
        next+= GetAuthStringLength();
        std::memcpy(next, path_, GetPathStringLength() * sizeof(Ch));
        next+= GetPathStringLength();
        std::memcpy(next, query_, GetQueryStringLength() * sizeof(Ch));
        next+= GetQueryStringLength();
        *next = '\0';
    }